

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::StrEq<char[12]>
            (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,StringLike<char[12]> *str)

{
  size_t sVar1;
  long lVar2;
  uint *local_68;
  long local_60;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint *local_48;
  long local_40;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined2 local_28;
  
  local_68 = &local_58;
  sVar1 = strlen(*str);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,str,*str + sVar1);
  lVar2 = local_60;
  if (local_68 == &local_58) {
    uStack_30 = uStack_50;
    uStack_2c = uStack_4c;
    local_68 = (uint *)&local_38;
  }
  local_38 = CONCAT44(uStack_54,local_58);
  local_40 = local_60;
  local_60 = 0;
  local_58 = local_58 & 0xffffff00;
  local_28 = 0x101;
  (__return_storage_ptr__->impl_).string_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->impl_).string_.field_2;
  lVar2 = lVar2 + (long)local_68;
  local_48 = local_68;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,local_48,lVar2);
  (__return_storage_ptr__->impl_).expect_eq_ = (bool)(undefined1)local_28;
  (__return_storage_ptr__->impl_).case_sensitive_ = (bool)local_28._1_1_;
  if (local_48 != (uint *)&local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT44(uStack_54,local_58) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::StrEqualityMatcher<std::string> > StrEq(
    const internal::StringLike<T>& str) {
  return MakePolymorphicMatcher(
      internal::StrEqualityMatcher<std::string>(std::string(str), true, true));
}